

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nagel.c
# Opt level: O3

void usage(void)

{
  fwrite("Usage: nagel input-path output-path seq-name. [-SG n.n] [-TG n.n] [-M n] [-I n] [-A n.n] [-D n.n] [-B cols rows] [-F n.n] [-C corr-vel-file nbins increment]\n"
         ,0x9d,1,_stderr);
  fwrite("[-SG n.n]        : sigma value for spatial gaussian\n",0x34,1,_stderr);
  fwrite("                   default value is 3.0\n",0x28,1,_stderr);
  fwrite("[-TG n.n]        : sigma value for temporal gaussian\n",0x35,1,_stderr);
  fwrite("                   default value is 1.5\n",0x28,1,_stderr);
  fwrite("[-M n]           : middle frame of image sequence\n",0x32,1,_stderr);
  fwrite("                   default value is 0\n",0x26,1,_stderr);
  fwrite("[-I n]           : number of relaxation iterations\n",0x33,1,_stderr);
  fwrite("                   default value is 10\n",0x27,1,_stderr);
  fwrite("[-A n.n]         : smoothing parameter alpha\n",0x2d,1,_stderr);
  fwrite("                   default value is 5.0\n",0x28,1,_stderr);
  fwrite("[-D n.n]         : delta parameter\n",0x23,1,_stderr);
  fwrite("                   default value is 1.0\n",0x28,1,_stderr);
  fwrite("[-B cols rows]   : for binary input files without header\n",0x39,1,_stderr);
  fwrite("[-F n.n]         : filters out unreliable estimates\n",0x34,1,_stderr);
  fwrite("                   using the magnitude of local gradient\n",0x39,1,_stderr);
  fwrite("[-C corr-vel-file nbins increment]\n",0x23,1,_stderr);
  fwrite("                 : error histogram\n",0x23,1,_stderr);
  fwrite("                   corr-vel-file : file of correct velocities\n",0x3e,1,_stderr);
  fwrite("                   nbins : number of bins for histogram\n",0x38,1,_stderr);
  fwrite("                   increment : value of gap between bins\n",0x39,1,_stderr);
  exit(1);
}

Assistant:

void usage()

{
  fprintf(stderr,"Usage: nagel input-path output-path seq-name. [-SG n.n] [-TG n.n] [-M n] [-I n] [-A n.n] [-D n.n] [-B cols rows] [-F n.n] [-C corr-vel-file nbins increment]\n") ;
  fprintf(stderr,"[-SG n.n]        : sigma value for spatial gaussian\n") ;
  fprintf(stderr,"                   default value is 3.0\n") ;
  fprintf(stderr,"[-TG n.n]        : sigma value for temporal gaussian\n") ;
  fprintf(stderr,"                   default value is 1.5\n") ;
  fprintf(stderr,"[-M n]           : middle frame of image sequence\n") ;
  fprintf(stderr,"                   default value is 0\n") ;
  fprintf(stderr,"[-I n]           : number of relaxation iterations\n") ;
  fprintf(stderr,"                   default value is 10\n") ;
  fprintf(stderr,"[-A n.n]         : smoothing parameter alpha\n") ;
  fprintf(stderr,"                   default value is 5.0\n") ;
  fprintf(stderr,"[-D n.n]         : delta parameter\n") ;
  fprintf(stderr,"                   default value is 1.0\n") ;
  fprintf(stderr,"[-B cols rows]   : for binary input files without header\n") ;
  fprintf(stderr,"[-F n.n]         : filters out unreliable estimates\n") ;
  fprintf(stderr,"                   using the magnitude of local gradient\n") ;
  fprintf(stderr,"[-C corr-vel-file nbins increment]\n") ;
  fprintf(stderr,"                 : error histogram\n") ;
  fprintf(stderr,"                   corr-vel-file : file of correct velocities\n") ;
  fprintf(stderr,"                   nbins : number of bins for histogram\n") ;
  fprintf(stderr,"                   increment : value of gap between bins\n") ;
  exit(EXIT_FAILURE) ;
}